

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

U32 ZSTD_scaleStats(uint *table,U32 lastEltIndex,U32 logTarget)

{
  uint uVar1;
  uint in_EDX;
  U32 in_ESI;
  uint *in_RDI;
  U32 factor;
  U32 prevsum;
  U32 in_stack_ffffffffffffffd8;
  U32 local_4;
  
  local_4 = sum_u32(in_RDI,(ulong)(in_ESI + 1));
  uVar1 = local_4 >> ((byte)in_EDX & 0x1f);
  if (0x1d < in_EDX) {
    __assert_fail("logTarget < 30",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7fa1,"U32 ZSTD_scaleStats(unsigned int *, U32, U32)");
  }
  if (1 < uVar1) {
    ZSTD_highbit32(0);
    local_4 = ZSTD_downscaleStats((uint *)CONCAT44(local_4,uVar1),in_ESI,in_stack_ffffffffffffffd8,
                                  (base_directive_e)((ulong)in_RDI >> 0x20));
  }
  return local_4;
}

Assistant:

static U32 ZSTD_scaleStats(unsigned* table, U32 lastEltIndex, U32 logTarget)
{
    U32 const prevsum = sum_u32(table, lastEltIndex+1);
    U32 const factor = prevsum >> logTarget;
    DEBUGLOG(5, "ZSTD_scaleStats (nbElts=%u, target=%u)", (unsigned)lastEltIndex+1, (unsigned)logTarget);
    assert(logTarget < 30);
    if (factor <= 1) return prevsum;
    return ZSTD_downscaleStats(table, lastEltIndex, ZSTD_highbit32(factor), base_1guaranteed);
}